

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSMisc.h
# Opt level: O2

double PID_angle_control(double psi_bar,double psi_bar_prev,double psi,double omega,double *pipsi,
                        double direction_coef,double dt,double Kp,double Kd,double Ki,double up_max,
                        double ud_max,double ui_max,double u_min,double u_max,double error_min,
                        double error_max,double omega_max)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  dVar1 = fmod_2PI(psi_bar - psi);
  if (dVar1 <= error_max) {
    if (error_min <= dVar1) {
      dVar2 = (double)(~-(ulong)(psi_bar != psi_bar_prev) & (ulong)*pipsi);
      dVar4 = (dVar1 * Kp) / 3.141592653589793;
      if (ABS(dVar4) <= up_max) {
        if (0.0 <= direction_coef) {
          dVar4 = 1.0;
        }
        else if (direction_coef <= 0.0) {
          dVar4 = -1.0;
        }
        else {
          dVar4 = 0.0;
        }
        dVar4 = (dVar4 * Kp * dVar1) / 3.141592653589793;
      }
      else {
        dVar6 = 1.0;
        dVar3 = 1.0;
        if (direction_coef < 0.0) {
          if (direction_coef <= 0.0) {
            dVar3 = -1.0;
          }
          else {
            dVar3 = 0.0;
          }
        }
        if ((dVar4 < 0.0) && (dVar6 = 0.0, dVar4 <= 0.0)) {
          dVar6 = -1.0;
        }
        dVar4 = dVar3 * dVar6 * up_max;
      }
      dVar6 = (-omega * Kd) / omega_max;
      if (ABS(dVar6) <= ud_max) {
        dVar6 = 0.0;
        if (0.0 <= direction_coef) {
          dVar6 = 1.0;
        }
        else if (direction_coef <= 0.0) {
          dVar6 = -1.0;
        }
        dVar6 = (dVar6 * Kd * -omega) / omega_max;
      }
      else {
        dVar7 = 1.0;
        dVar3 = 1.0;
        if (direction_coef < 0.0) {
          if (direction_coef <= 0.0) {
            dVar3 = -1.0;
          }
          else {
            dVar3 = 0.0;
          }
        }
        if ((dVar6 < 0.0) && (dVar7 = 0.0, dVar6 <= 0.0)) {
          dVar7 = -1.0;
        }
        dVar6 = dVar3 * dVar7 * ud_max;
      }
      dVar3 = (dVar2 * Ki) / 3.141592653589793;
      if (ABS(dVar3) <= ui_max) {
        dVar3 = 0.0;
        if (0.0 <= direction_coef) {
          dVar3 = 1.0;
        }
        else if (direction_coef <= 0.0) {
          dVar3 = -1.0;
        }
        dVar3 = (dVar3 * Ki * dVar2) / 3.141592653589793;
      }
      else {
        dVar5 = 1.0;
        dVar7 = 1.0;
        if (direction_coef < 0.0) {
          if (direction_coef <= 0.0) {
            dVar7 = -1.0;
          }
          else {
            dVar7 = 0.0;
          }
        }
        if ((dVar3 < 0.0) && (dVar5 = 0.0, dVar3 <= 0.0)) {
          dVar5 = -1.0;
        }
        dVar3 = dVar7 * dVar5 * ui_max;
      }
      dVar3 = dVar3 + dVar6 + dVar4 + 0.0;
      dVar2 = dVar1 * dt + dVar2;
    }
    else {
      dVar2 = 0.0;
      if (0.0 <= direction_coef) {
        dVar3 = 1.0;
      }
      else {
        dVar3 = 0.0;
        if (direction_coef <= 0.0) {
          dVar3 = -1.0;
        }
      }
      dVar3 = dVar3 * u_min;
    }
  }
  else {
    dVar2 = 0.0;
    if (0.0 <= direction_coef) {
      dVar3 = 1.0;
    }
    else {
      dVar3 = 0.0;
      if (direction_coef <= 0.0) {
        dVar3 = -1.0;
      }
    }
    dVar3 = dVar3 * u_max;
  }
  if (dVar3 <= u_max) {
    u_max = dVar3;
  }
  *pipsi = dVar2;
  return (double)(-(ulong)(dVar3 < u_min) & (ulong)u_min | ~-(ulong)(dVar3 < u_min) & (ulong)u_max);
}

Assistant:

inline double PID_angle_control(double psi_bar, double psi_bar_prev, double psi, double omega, double* pipsi, double direction_coef, double dt,
	double Kp, double Kd, double Ki, double up_max, double ud_max, double ui_max,
	double u_min, double u_max, double error_min, double error_max, double omega_max)
{
	double u = 0;
	double error = fmod_2PI(psi_bar-psi);
	double derivative = -omega;
	double integral = *pipsi;
	if (psi_bar != psi_bar_prev) integral = 0;
	if (error > error_max)
	{
		u = sign(direction_coef, 0)*u_max;
		integral = 0;
	}
	else if (error < error_min)
	{
		u = sign(direction_coef, 0)*u_min;
		integral = 0;
	}
	else
	{
		if (fabs(Kp*error/M_PI) > up_max) u += sign(direction_coef, 0)*sign(Kp*error/M_PI, 0)*up_max;
		else u += sign(direction_coef, 0)*Kp*error/M_PI; // /M_PI to try to normalize...
		if (fabs(Kd*derivative/omega_max) > ud_max) u += sign(direction_coef, 0)*sign(Kd*derivative/omega_max, 0)*ud_max;
		else u += sign(direction_coef, 0)*Kd*derivative/omega_max; // /omegaz_max to try to normalize...
		if (fabs(Ki*integral/M_PI) > ui_max) u += sign(direction_coef, 0)*sign(Ki*integral/M_PI, 0)*ui_max;
		else u += sign(direction_coef, 0)*Ki*integral/M_PI; // /M_PI to try to normalize...
		integral = integral+error*dt;
	}
	u = (u < u_min)? u_min: ((u > u_max)? u_max: u);
	*pipsi = integral;
	return u;
}